

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupAppendNew(Gia_Man_t *pOne,Gia_Man_t *pTwo)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  uint uVar6;
  Gia_Man_t *p;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  
  p = Gia_ManStart(pTwo->nObjs + pOne->nObjs);
  pcVar1 = pOne->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p->pName = pcVar8;
  pcVar1 = pOne->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar1);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar1);
  }
  p->pSpec = pcVar8;
  Gia_ManHashAlloc(p);
  pOne->pObjs->Value = 0;
  if (1 < pOne->nObjs) {
    lVar16 = 1;
    lVar15 = 0x14;
    do {
      pGVar2 = pOne->pObjs;
      uVar3 = *(ulong *)((long)pGVar2 + lVar15 + -8);
      if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)(uint)uVar3 < 0) {
        if (((uint)uVar3 & 0x9fffffff) == 0x9fffffff) {
          pGVar9 = Gia_ManAppendObj(p);
          uVar3 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar3 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p->pObjs;
          if ((pGVar4 <= pGVar9) && (pGVar9 < pGVar4 + p->nObjs)) {
            Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
            pGVar4 = p->pObjs;
            if ((pGVar4 <= pGVar9) && (pGVar9 < pGVar4 + p->nObjs)) {
              iVar5 = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
              goto LAB_00678e98;
            }
          }
          goto LAB_006793a6;
        }
      }
      else {
        uVar6 = *(uint *)((long)pGVar2 + lVar15 + (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3
                         );
        if (((int)uVar6 < 0) ||
           (uVar11 = *(uint *)((long)pGVar2 +
                              lVar15 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar11 < 0)) goto LAB_00679368;
        iVar5 = Gia_ManHashAnd(p,uVar6 ^ (uint)(uVar3 >> 0x1d) & 1,
                               uVar11 ^ (uint)(uVar3 >> 0x3d) & 1);
LAB_00678e98:
        *(int *)(&pGVar2->field_0x0 + lVar15) = iVar5;
      }
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0xc;
    } while (lVar16 < pOne->nObjs);
  }
  pTwo->pObjs->Value = 0;
  if (pTwo->nObjs < 2) {
LAB_006790bc:
    Gia_ManHashStop(p);
    iVar5 = pOne->nRegs;
    pVVar10 = pOne->vCos;
    iVar14 = pVVar10->nSize;
    if (iVar5 < iVar14) {
      lVar15 = 0;
      do {
        if (iVar14 <= lVar15) goto LAB_00679387;
        iVar14 = pVVar10->pArray[lVar15];
        if (((long)iVar14 < 0) || (pOne->nObjs <= iVar14)) goto LAB_00679349;
        if (pOne->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = pOne->pObjs + iVar14;
        if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0)
        goto LAB_00679368;
        uVar6 = Gia_ManAppendCo(p,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                  pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value);
        pGVar2->Value = uVar6;
        lVar15 = lVar15 + 1;
        iVar5 = pOne->nRegs;
        pVVar10 = pOne->vCos;
        iVar14 = pVVar10->nSize;
      } while (lVar15 < iVar14 - iVar5);
    }
    iVar14 = pTwo->nRegs;
    pVVar10 = pTwo->vCos;
    iVar13 = pVVar10->nSize;
    if (iVar14 < iVar13) {
      lVar15 = 0;
      do {
        if (iVar13 <= lVar15) goto LAB_00679387;
        iVar5 = pVVar10->pArray[lVar15];
        if (((long)iVar5 < 0) || (pTwo->nObjs <= iVar5)) goto LAB_00679349;
        if (pTwo->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = pTwo->pObjs + iVar5;
        if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0)
        goto LAB_00679368;
        uVar6 = Gia_ManAppendCo(p,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                  pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value);
        pGVar2->Value = uVar6;
        lVar15 = lVar15 + 1;
        iVar14 = pTwo->nRegs;
        pVVar10 = pTwo->vCos;
        iVar13 = pVVar10->nSize;
      } while (lVar15 < iVar13 - iVar14);
      iVar5 = pOne->nRegs;
    }
    if (0 < iVar5) {
      iVar14 = 0;
      do {
        iVar13 = pOne->vCos->nSize;
        uVar6 = (iVar13 - iVar5) + iVar14;
        if (((int)uVar6 < 0) || (iVar13 <= (int)uVar6)) goto LAB_00679387;
        iVar13 = pOne->vCos->pArray[uVar6];
        if (((long)iVar13 < 0) || (pOne->nObjs <= iVar13)) goto LAB_00679349;
        if (pOne->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = pOne->pObjs + iVar13;
        if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0)
        goto LAB_00679368;
        uVar6 = Gia_ManAppendCo(p,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                  pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value);
        pGVar2->Value = uVar6;
        iVar14 = iVar14 + 1;
        iVar5 = pOne->nRegs;
      } while (iVar14 < iVar5);
      iVar14 = pTwo->nRegs;
    }
    if (0 < iVar14) {
      iVar5 = 0;
      do {
        iVar13 = pTwo->vCos->nSize;
        uVar6 = (iVar13 - iVar14) + iVar5;
        if (((int)uVar6 < 0) || (iVar13 <= (int)uVar6)) {
LAB_00679387:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar13 = pTwo->vCos->pArray[uVar6];
        if (((long)iVar13 < 0) || (pTwo->nObjs <= iVar13)) {
LAB_00679349:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pTwo->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar2 = pTwo->pObjs + iVar13;
        if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_00679368:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        uVar6 = Gia_ManAppendCo(p,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                  pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value);
        pGVar2->Value = uVar6;
        iVar5 = iVar5 + 1;
        iVar14 = pTwo->nRegs;
      } while (iVar5 < iVar14);
      iVar5 = pOne->nRegs;
    }
    Gia_ManSetRegNum(p,iVar5 + iVar14);
    return p;
  }
  lVar15 = 1;
  lVar16 = 0x14;
LAB_00678ed6:
  pGVar2 = pTwo->pObjs;
  uVar3 = *(ulong *)((long)pGVar2 + lVar16 + -8);
  uVar6 = (uint)uVar3;
  uVar11 = (uint)(uVar3 >> 0x20);
  if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)uVar6 < 0) {
    if ((uVar6 & 0x9fffffff) != 0x9fffffff) goto LAB_00678fe3;
    uVar12 = uVar11 & 0x1fffffff;
    if (pTwo->vCis->nSize - pTwo->nRegs <= (int)uVar12) {
      pGVar9 = Gia_ManAppendObj(p);
      uVar3 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p->pObjs;
      if ((pGVar4 <= pGVar9) && (pGVar9 < pGVar4 + p->nObjs)) {
        Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p->pObjs;
        if ((pGVar4 <= pGVar9) && (pGVar9 < pGVar4 + p->nObjs)) {
          uVar6 = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
          goto LAB_00678fdf;
        }
      }
LAB_006793a6:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (-1 < (int)uVar6) {
      __assert_fail("pObj->fTerm",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ac,"int Gia_ObjCioId(Gia_Obj_t *)");
    }
    iVar5 = pOne->vCis->nSize;
    if (iVar5 - pOne->nRegs <= (int)uVar12) {
      __assert_fail("v < Gia_ManPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a6,"Gia_Obj_t *Gia_ManPi(Gia_Man_t *, int)");
    }
    if (iVar5 <= (int)uVar12) goto LAB_00679387;
    iVar5 = pOne->vCis->pArray[uVar11 & 0x1fffffff];
    if (((long)iVar5 < 0) || (pOne->nObjs <= iVar5)) goto LAB_00679349;
    uVar6 = pOne->pObjs[iVar5].Value;
  }
  else {
    uVar6 = *(uint *)((long)pGVar2 + lVar16 + (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3);
    if (((int)uVar6 < 0) ||
       (uVar12 = *(uint *)((long)pGVar2 + lVar16 + (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3)
       , (int)uVar12 < 0)) goto LAB_00679368;
    uVar6 = Gia_ManHashAnd(p,uVar6 ^ (uint)(uVar3 >> 0x1d) & 1,uVar12 ^ uVar11 >> 0x1d & 1);
  }
LAB_00678fdf:
  *(uint *)(&pGVar2->field_0x0 + lVar16) = uVar6;
LAB_00678fe3:
  lVar15 = lVar15 + 1;
  lVar16 = lVar16 + 0xc;
  if (pTwo->nObjs <= lVar15) goto LAB_006790bc;
  goto LAB_00678ed6;
}

Assistant:

Gia_Man_t * Gia_ManDupAppendNew( Gia_Man_t * pOne, Gia_Man_t * pTwo )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(pOne) + Gia_ManObjNum(pTwo) );
    pNew->pName = Abc_UtilStrsav( pOne->pName );
    pNew->pSpec = Abc_UtilStrsav( pOne->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(pOne)->Value = 0;
    Gia_ManForEachObj1( pOne, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    Gia_ManConst0(pTwo)->Value = 0;
    Gia_ManForEachObj1( pTwo, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsPi(pTwo, pObj) )
            pObj->Value = Gia_ManPi(pOne, Gia_ObjCioId(pObj))->Value;
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    Gia_ManHashStop( pNew );
    // primary outputs
    Gia_ManForEachPo( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPo( pTwo, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // flop inputs
    Gia_ManForEachRi( pOne, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( pTwo, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(pOne) + Gia_ManRegNum(pTwo) );
    return pNew;
}